

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.hpp
# Opt level: O0

void __thiscall
deqp::egl::NamedFilterList::NamedFilterList(NamedFilterList *this,char *name,char *description)

{
  char *pcVar1;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  char *local_20;
  char *description_local;
  char *name_local;
  NamedFilterList *this_local;
  
  local_20 = description;
  description_local = name;
  name_local = (char *)this;
  eglu::FilterList::FilterList(&this->super_FilterList);
  pcVar1 = description_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,pcVar1,&local_21);
  std::allocator<char>::~allocator(&local_21);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_description,pcVar1,local_35)
  ;
  std::allocator<char>::~allocator(local_35);
  return;
}

Assistant:

NamedFilterList		(const char* name, const char* description) : m_name(name), m_description(description) {}